

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

int Ivy_ObjIsInTfi_rec(Ivy_Obj_t *pObjNew,Ivy_Obj_t *pObjOld,int Levels)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int Levels_local;
  Ivy_Obj_t *pObjOld_local;
  Ivy_Obj_t *pObjNew_local;
  
  if (pObjNew == pObjOld) {
    return 1;
  }
  if (((Levels != 0) && (iVar1 = Ivy_ObjIsCi(pObjNew), iVar1 == 0)) &&
     (iVar1 = Ivy_ObjIsConst1(pObjNew), iVar1 == 0)) {
    pIVar2 = Ivy_ObjFanin0(pObjNew);
    iVar1 = Ivy_ObjIsInTfi_rec(pIVar2,pObjOld,Levels + -1);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Ivy_ObjIsNode(pObjNew);
    if (iVar1 != 0) {
      pIVar2 = Ivy_ObjFanin1(pObjNew);
      iVar1 = Ivy_ObjIsInTfi_rec(pIVar2,pObjOld,Levels + -1);
      if (iVar1 != 0) {
        return 1;
      }
    }
    return 0;
  }
  return 0;
}

Assistant:

int Ivy_ObjIsInTfi_rec( Ivy_Obj_t * pObjNew, Ivy_Obj_t * pObjOld, int Levels )
{
    if ( pObjNew == pObjOld )
        return 1;
    if ( Levels == 0 || Ivy_ObjIsCi(pObjNew) || Ivy_ObjIsConst1(pObjNew) )
        return 0;
    if ( Ivy_ObjIsInTfi_rec( Ivy_ObjFanin0(pObjNew), pObjOld, Levels - 1 ) )
        return 1;
    if ( Ivy_ObjIsNode(pObjNew) && Ivy_ObjIsInTfi_rec( Ivy_ObjFanin1(pObjNew), pObjOld, Levels - 1 ) )
        return 1;
    return 0;
}